

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O0

RTCScene embree::convertScene(ISPCScene *scene_in)

{
  RTCScene pRVar1;
  long in_RDI;
  RTCScene scene_out;
  RTCFeatureFlags feature_mask;
  ISPCGeometry *geometry;
  uint i;
  RTCFeatureFlags *in_stack_00000090;
  RTCSceneFlags in_stack_00000098;
  RTCBuildQuality in_stack_0000009c;
  ISPCScene *in_stack_000000a0;
  RTCDevice in_stack_000000a8;
  uint local_c;
  
  local_c = 0;
  do {
    if (*(uint *)(in_RDI + 0x18) <= local_c) {
LAB_0012fd97:
      pRVar1 = ConvertScene(in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
                            in_stack_00000090);
      if ((g_use_scene_features & 1U) != 0) {
        g_feature_mask = RTC_FEATURE_FLAG_NONE;
      }
      rtcSetSceneProgressMonitorFunction(pRVar1,monitorProgressFunction,0);
      return pRVar1;
    }
    if (**(int **)(*(long *)(in_RDI + 8) + (ulong)local_c * 8) == 1) {
      data[0x20] = 1;
      goto LAB_0012fd97;
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

RTCScene convertScene(ISPCScene* scene_in)
{
  for (unsigned int i=0; i<scene_in->numGeometries; i++)
  {
    ISPCGeometry* geometry = scene_in->geometries[i];
    if (geometry->type == SUBDIV_MESH) {
      data.subdiv_mode = true; break;
    }
  }

  RTCFeatureFlags feature_mask = RTC_FEATURE_FLAG_NONE;
  RTCScene scene_out = ConvertScene(g_device, g_ispc_scene, RTC_BUILD_QUALITY_MEDIUM, RTC_SCENE_FLAG_NONE, &feature_mask);
  if (g_use_scene_features) g_feature_mask = feature_mask;
  rtcSetSceneProgressMonitorFunction(scene_out,monitorProgressFunction,nullptr);

  /* commit changes to scene */
  return scene_out;
}